

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void testing::internal::CaptureStream(int fd,char *stream_name,CapturedStream **stream)

{
  size_t sVar1;
  CapturedStream *this;
  GTestLog local_24;
  
  if (*stream != (CapturedStream *)0x0) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-port.cc"
                       ,0x252);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Only one ",9);
    if (stream_name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x13b580);
    }
    else {
      sVar1 = strlen(stream_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,stream_name,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," capturer can exist at a time.",0x1e);
    GTestLog::~GTestLog(&local_24);
  }
  this = (CapturedStream *)operator_new(0x28);
  CapturedStream::CapturedStream(this,fd);
  *stream = this;
  return;
}

Assistant:

void CaptureStream(int fd, const char* stream_name, CapturedStream** stream) {
  if (*stream != NULL) {
    GTEST_LOG_(FATAL) << "Only one " << stream_name
                      << " capturer can exist at a time.";
  }
  *stream = new CapturedStream(fd);
}